

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader.cpp
# Opt level: O2

uint32_t __thiscall Shader::create_shader(Shader *this,char *source,uint32_t type)

{
  GLuint object;
  string *this_00;
  Shader *this_01;
  char *text_c;
  string text;
  
  this_00 = &text;
  load_file_abi_cxx11_(&text,source);
  text_c = text._M_dataplus._M_p;
  fix_version((Shader *)this_00,&text);
  object = (*glad_glCreateShader)(type);
  (*glad_glShaderSource)(object,1,&text_c,(GLint *)0x0);
  this_01 = (Shader *)(ulong)object;
  (*glad_glCompileShader)(object);
  check_errors(this_01,object,1);
  std::__cxx11::string::~string((string *)&text);
  return object;
}

Assistant:

uint32_t Shader::create_shader(const char *source, uint32_t type)
{
    std::string text = load_file(source);
    const char* text_c = text.data();

    fix_version(text);

    GLuint shader = glCreateShader(type);
    glShaderSource(shader, 1, &text_c, nullptr);
    glCompileShader(shader);

    // Check any compilation errors
    check_errors(shader, COMPILE_ERRORS);

    return shader;
}